

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

void __thiscall asmjit::v1_14::CodeHolder::CodeHolder(CodeHolder *this,Temporary *temporary)

{
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  (this->_environment)._arch = kUnknown;
  (this->_environment)._subArch = kHost;
  (this->_environment)._vendor = kHost;
  (this->_environment)._platform = kUnknown;
  (this->_environment)._platformABI = kUnknown;
  (this->_environment)._objectFormat = kUnknown;
  (this->_environment)._floatABI = kHardFloat;
  (this->_environment)._reserved = '\0';
  *(undefined8 *)&this->_cpuFeatures = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  this->_baseAddress = 0xffffffffffffffff;
  this->_logger = (Logger *)0x0;
  this->_errorHandler = (ErrorHandler *)0x0;
  Zone::_init(&this->_zone,0x4000,1,temporary);
  *(Zone **)&this->_allocator = &this->_zone;
  memset(&this->field_0x70,0,0xa8);
  *(undefined1 **)&this->_namedLabels = &this->field_0x138;
  *(undefined8 *)&this->field_0x120 = 0;
  *(undefined8 *)&this->field_0x128 = 0x100000001;
  *(undefined4 *)&this->field_0x130 = 1;
  *(undefined2 *)&this->field_0x134 = 0;
  *(undefined8 *)&this->field_0x138 = 0;
  this->_unresolvedLinkCount = 0;
  this->_addressTableSection = (Section *)0x0;
  *(undefined8 *)&this->_addressTableEntries = 0;
  return;
}

Assistant:

CodeHolder::CodeHolder(const Support::Temporary* temporary) noexcept
  : _environment(),
    _cpuFeatures{},
    _baseAddress(Globals::kNoBaseAddress),
    _logger(nullptr),
    _errorHandler(nullptr),
    _zone(16u * 1024u, 1, temporary),
    _allocator(&_zone),
    _unresolvedLinkCount(0),
    _addressTableSection(nullptr) {}